

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * el::base::utils::OS::currentHost_abi_cxx11_(void)

{
  char *in_RCX;
  string *in_RDI;
  char *in_R8;
  
  getEnvironmentVariable_abi_cxx11_(in_RDI,(OS *)"HOSTNAME","unknown-host",in_RCX,in_R8);
  return in_RDI;
}

Assistant:

std::string OS::currentHost(void) {
#if ELPP_OS_UNIX && !ELPP_OS_ANDROID
  return getEnvironmentVariable("HOSTNAME", base::consts::kUnknownHost, "hostname");
#elif ELPP_OS_WINDOWS
  return getEnvironmentVariable("COMPUTERNAME", base::consts::kUnknownHost);
#elif ELPP_OS_ANDROID
  ELPP_UNUSED(base::consts::kUnknownHost);
  return getDeviceName();
#else
  return std::string();
#endif  // ELPP_OS_UNIX && !ELPP_OS_ANDROID
}